

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void nes_stream_update_mame(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  NESAPU_INF *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *chip_local;
  
  nes_apu_update(*(void **)((long)chip + 8),samples,outputs);
  if (*(long *)((long)chip + 0x18) != 0) {
    nes_render_fds(*(void **)((long)chip + 0x18),samples,outputs);
  }
  return;
}

Assistant:

static void nes_stream_update_mame(void* chip, UINT32 samples, DEV_SMPL** outputs)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	nes_apu_update(info->chip_apu, samples, outputs);
	
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		nes_render_fds(info->chip_fds, samples, outputs);
#endif
	
	return;
}